

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<fmt::v7::basic_string_view<char>,unsigned_long,unsigned_int&>
          (logger *this,source_loc loc,level_enum lvl,basic_string_view<char> *fmt,
          unsigned_long *args,uint *args_1)

{
  char *s;
  size_t count;
  uint *in_RDI;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000010;
  log_msg *in_stack_00000018;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  logger *in_stack_fffffffffffffd48;
  logger *in_stack_fffffffffffffd50;
  unsigned_long *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  level_enum in_stack_fffffffffffffdac;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  string_view_t in_stack_fffffffffffffdb8;
  string_view_t in_stack_fffffffffffffdc8;
  source_loc in_stack_fffffffffffffde0;
  basic_string_view<char> local_208 [2];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_1e0;
  log_msg *local_1d8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_170;
  allocator<char> local_151;
  buffer<char> local_150 [9];
  undefined1 local_2a;
  byte local_29;
  
  local_29 = should_log(in_stack_fffffffffffffd48,
                        (level_enum)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  local_2a = details::backtracer::enabled((backtracer *)0x14b4bb);
  if (((local_29 & 1) != 0) || ((bool)local_2a)) {
    std::allocator<char>::allocator();
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd40,(allocator<char> *)in_stack_fffffffffffffd38);
    std::allocator<char>::~allocator(&local_151);
    local_170.container =
         (buffer<char> *)
         ::fmt::v7::
         format_to<fmt::v7::basic_string_view<char>,unsigned_long,unsigned_int&,250ul,char>
                   (in_stack_fffffffffffffdb0,
                    (basic_string_view<char> *)
                    CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                    in_stack_fffffffffffffda0,in_RDI);
    local_1d8 = in_stack_00000018;
    pbStack_1e0 = in_stack_00000010;
    ::fmt::v7::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    s = ::fmt::v7::detail::buffer<char>::data(local_150);
    count = ::fmt::v7::detail::buffer<char>::size(local_150);
    ::fmt::v7::basic_string_view<char>::basic_string_view(local_208,s,count);
    details::log_msg::log_msg
              ((log_msg *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffde0,
               in_stack_fffffffffffffdc8,in_stack_fffffffffffffdac,in_stack_fffffffffffffdb8);
    log_it_(in_stack_fffffffffffffd50,local_1d8,SUB81((ulong)pbStack_1e0 >> 0x38,0),
            SUB81((ulong)pbStack_1e0 >> 0x30,0));
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (pbStack_1e0);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, const FormatString &fmt, Args&&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, std::forward<Args>(args)...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }